

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

Pattern * __thiscall
trieste::detail::Pattern::operator~(Pattern *__return_storage_ptr__,Pattern *this)

{
  shared_ptr<trieste::detail::PatternDef> local_a8;
  PatternPtr local_98;
  FastPattern local_88;
  
  std::make_shared<trieste::detail::Opt,std::shared_ptr<trieste::detail::PatternDef>const&>
            (&local_a8);
  local_98.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_a8.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_a8.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_a8.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  FastPattern::match_opt(&local_88,&this->fast_pattern);
  Pattern(__return_storage_ptr__,&local_98,&local_88);
  FastPattern::~FastPattern(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Pattern operator~() const
      {
        return {
          std::make_shared<Opt>(pattern), FastPattern::match_opt(fast_pattern)};
      }